

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::AddCopy
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  void *local_28;
  void *copy;
  void *pvStack_18;
  int size_local;
  void *encoded_file_descriptor_local;
  EncodedDescriptorDatabase *this_local;
  
  copy._4_4_ = size;
  pvStack_18 = encoded_file_descriptor;
  encoded_file_descriptor_local = this;
  local_28 = operator_new((long)size);
  memcpy(local_28,pvStack_18,(long)copy._4_4_);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->files_to_delete_,&local_28);
  bVar1 = Add(this,local_28,copy._4_4_);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::AddCopy(
    const void* PROTOBUF_NONNULL encoded_file_descriptor, int size) {
  void* copy = operator new(size);
  memcpy(copy, encoded_file_descriptor, size);
  files_to_delete_.push_back(copy);
  return Add(copy, size);
}